

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O1

int mbedtls_asn1_traverse_sequence_of
              (uchar **p,uchar *end,uchar tag_must_mask,uchar tag_must_val,uchar tag_may_mask,
              uchar tag_may_val,_func_int_void_ptr_int_uchar_ptr_size_t *cb,void *ctx)

{
  byte bVar1;
  uchar *puVar2;
  byte *pbVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  size_t local_40;
  size_t len;
  
  uVar7 = CONCAT71(in_register_00000011,tag_must_mask) & 0xffffffff;
  puVar2 = *p;
  if (end == puVar2 || (long)end - (long)puVar2 < 0) {
    iVar5 = -0x60;
  }
  else {
    iVar5 = -0x62;
    if (*puVar2 == '0') {
      *p = puVar2 + 1;
      iVar5 = mbedtls_asn1_get_len(p,end,&local_40);
    }
  }
  if ((iVar5 == 0) && (iVar5 = -0x66, *p + local_40 == end)) {
    len._4_4_ = (uint)CONCAT71(in_register_00000011,tag_must_mask);
    do {
      pbVar3 = *p;
      if (end <= pbVar3) {
        return 0;
      }
      *p = pbVar3 + 1;
      bVar1 = *pbVar3;
      if ((bVar1 & (byte)uVar7) == tag_must_val) {
        iVar6 = mbedtls_asn1_get_len(p,end,&local_40);
        if ((iVar6 == 0) &&
           (((cb == (_func_int_void_ptr_int_uchar_ptr_size_t *)0x0 ||
             ((bVar1 & tag_may_mask) != tag_may_val)) ||
            (iVar6 = (*cb)(ctx,(int)bVar1,*p,local_40), iVar6 == 0)))) {
          *p = *p + local_40;
          bVar4 = true;
        }
        else {
          iVar5 = iVar6;
          bVar4 = false;
        }
        uVar7 = (ulong)len._4_4_;
      }
      else {
        iVar5 = -0x62;
        bVar4 = false;
      }
    } while (bVar4);
  }
  return iVar5;
}

Assistant:

int mbedtls_asn1_traverse_sequence_of(
    unsigned char **p,
    const unsigned char *end,
    unsigned char tag_must_mask, unsigned char tag_must_val,
    unsigned char tag_may_mask, unsigned char tag_may_val,
    int (*cb)(void *ctx, int tag,
              unsigned char *start, size_t len),
    void *ctx)
{
    int ret;
    size_t len;

    /* Get main sequence tag */
    if ((ret = mbedtls_asn1_get_tag(p, end, &len,
                                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
        return ret;
    }

    if (*p + len != end) {
        return MBEDTLS_ERR_ASN1_LENGTH_MISMATCH;
    }

    while (*p < end) {
        unsigned char const tag = *(*p)++;

        if ((tag & tag_must_mask) != tag_must_val) {
            return MBEDTLS_ERR_ASN1_UNEXPECTED_TAG;
        }

        if ((ret = mbedtls_asn1_get_len(p, end, &len)) != 0) {
            return ret;
        }

        if ((tag & tag_may_mask) == tag_may_val) {
            if (cb != NULL) {
                ret = cb(ctx, tag, *p, len);
                if (ret != 0) {
                    return ret;
                }
            }
        }

        *p += len;
    }

    return 0;
}